

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask9_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long unaff_RBP;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  vpmovsxbd_avx(ZEXT416(0x38281c0c));
  auVar3 = vpmovsxbd_avx(ZEXT416(0xc010d09));
  vpmovsxbd_avx(ZEXT416(0x34241808));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[8] << 8)));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar4 = vpsllvd_avx2(auVar7,_DAT_0019db90);
  auVar7 = vpinsrd_avx(ZEXT416(in[1]),in[5],1);
  auVar7 = vinsertps_avx(auVar7,auVar6,0x68);
  auVar2 = vpinsrd_avx(auVar7,in[0xc],3);
  auVar5 = vpsrlvd_avx2(auVar7,auVar3);
  auVar7 = vpsllvd_avx2(auVar2,auVar3);
  auVar3 = vpsllvd_avx2(auVar6,_DAT_0019dba0);
  auVar2 = vpblendd_avx2(auVar7,auVar5,4);
  auVar7 = vpinsrd_avx(ZEXT416(*in),auVar6._0_4_ >> 5 | in[4] << 4,1);
  auVar7 = vpinsrd_avx(auVar7,in[8] << 8,2);
  auVar7 = vpinsrd_avx(auVar7,auVar6._8_4_ >> 6 | in[0xb] << 3,3);
  uVar1 = in[0xf];
  auVar7 = vpor_avx(auVar2,auVar7);
  auVar7 = vpternlogd_avx512vl(auVar3,auVar4,auVar7,0xfe);
  *(undefined1 (*) [16])out = auVar7;
  out[4] = uVar1 << 7 | auVar6._12_4_ >> 2;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask9_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (9 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (9 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;

  return out + 1;
}